

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_sse_copy2str(FIOBJ dest,char *prefix,size_t pre_len,fio_str_info_s data)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  char *local_30;
  char *pos;
  char *stop;
  size_t pre_len_local;
  char *prefix_local;
  FIOBJ dest_local;
  
  if (data.len != 0) {
    pcVar1 = data.data + data.len;
    for (; data.len != 0; data.len = data.len - lVar2) {
      fiobj_str_write(dest,prefix,pre_len);
      local_30 = data.data;
      while( true ) {
        bVar3 = false;
        if ((local_30 < pcVar1) && (bVar3 = false, *local_30 != '\n')) {
          bVar3 = *local_30 != '\r';
        }
        if (!bVar3) break;
        local_30 = local_30 + 1;
      }
      fiobj_str_write(dest,data.data,(long)local_30 - (long)data.data);
      fiobj_str_write(dest,"\r\n",2);
      if (*local_30 == '\r') {
        local_30 = local_30 + 1;
      }
      if (*local_30 == '\n') {
        local_30 = local_30 + 1;
      }
      lVar2 = (long)local_30 - (long)data.data;
      data.data = local_30;
    }
  }
  return;
}

Assistant:

static inline void http_sse_copy2str(FIOBJ dest, char *prefix, size_t pre_len,
                                     fio_str_info_s data) {
  if (!data.len)
    return;
  const char *stop = data.data + data.len;
  while (data.len) {
    fiobj_str_write(dest, prefix, pre_len);
    char *pos = data.data;
    while (pos < stop && *pos != '\n' && *pos != '\r')
      ++pos;
    fiobj_str_write(dest, data.data, (uintptr_t)(pos - data.data));
    fiobj_str_write(dest, "\r\n", 2);
    if (*pos == '\r')
      ++pos;
    if (*pos == '\n')
      ++pos;
    data.len -= (uintptr_t)(pos - data.data);
    data.data = pos;
  }
}